

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O3

void __thiscall pg::PPSolver::run(PPSolver *this)

{
  Game *pGVar1;
  int *piVar2;
  uint64_t *puVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer piVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  uint to;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  int *__s;
  int *piVar12;
  ostream *poVar13;
  int iVar14;
  uint p;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint i;
  pointer *ppiVar18;
  ulong uVar19;
  
  pGVar1 = (this->super_Solver).game;
  uVar16 = pGVar1->n_vertices;
  piVar2 = pGVar1->_priority;
  iVar14 = *(int *)((long)piVar2 + ((long)((uVar16 << 0x20) + -0x100000000) >> 0x1e));
  this->max_prio = iVar14;
  uVar19 = (ulong)(iVar14 + 1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar19;
  uVar9 = SUB168(auVar7 * ZEXT816(0x18),0);
  uVar15 = uVar9 + 8;
  if (0xfffffffffffffff7 < uVar9) {
    uVar15 = 0xffffffffffffffff;
  }
  if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  puVar10 = (ulong *)operator_new__(uVar15);
  *puVar10 = uVar19;
  if (iVar14 != -1) {
    memset((vector<int,_std::allocator<int>_> *)(puVar10 + 1),0,
           ((uVar9 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  this->regions = (vector<int,_std::allocator<int>_> *)(puVar10 + 1);
  uVar9 = -(ulong)(uVar16 >> 0x3e != 0) | uVar16 * 4;
  piVar11 = (int *)operator_new__(uVar9);
  this->region = piVar11;
  __s = (int *)operator_new__(uVar9);
  uVar19 = uVar19 << 2;
  this->strategy = __s;
  if (iVar14 < -1) {
    uVar19 = 0xffffffffffffffff;
  }
  piVar12 = (int *)operator_new__(uVar19);
  this->inverse = piVar12;
  if (0 < (long)uVar16) {
    uVar9 = 0;
    puVar3 = ((this->super_Solver).disabled)->_bits;
    do {
      iVar14 = -2;
      if ((puVar3[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
        iVar14 = piVar2[uVar9];
      }
      piVar11[uVar9] = iVar14;
      uVar9 = uVar9 + 1;
    } while (uVar16 != uVar9);
    if (0 < (long)uVar16) {
      memset(__s,0xff,uVar16 * 4);
    }
  }
  i = (int)uVar16 - 1;
  this->promotions = 0;
joined_r0x0015b282:
  while (-1 < (int)i) {
    piVar2 = ((this->super_Solver).game)->_priority;
    p = piVar2[i];
    while (uVar16 = (ulong)i, piVar2[uVar16] == p) {
      if (((((this->super_Solver).disabled)->_bits[i >> 6] >> (uVar16 & 0x3f) & 1) == 0) &&
         (this->region[uVar16] <= (int)p)) {
        this->inverse[(int)p] = i;
        bVar8 = setupRegion(this,i,p,true);
        if (bVar8) goto LAB_0015b318;
        goto LAB_0015b368;
      }
      bVar8 = (int)i < 1;
      i = i - 1;
      if (bVar8) goto LAB_0015b3be;
    }
    if (this->regions[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        this->regions[(int)p].super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      resetRegion(this,p);
    }
  }
LAB_0015b3be:
  pvVar4 = this->regions;
  if (pvVar4 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar5 = pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    ppiVar18 = &pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    if (piVar5 != (pointer)0x0) {
      lVar17 = (long)piVar5 * 0x18;
      do {
        pvVar6 = *(void **)((long)&pvVar4[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar17);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,*(long *)((long)ppiVar18 + lVar17) - (long)pvVar6);
        }
        lVar17 = lVar17 + -0x18;
      } while (lVar17 != 0);
    }
    operator_delete__(ppiVar18,(long)piVar5 * 0x18 + 8);
  }
  if (this->region != (int *)0x0) {
    operator_delete__(this->region);
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->inverse != (int *)0x0) {
    operator_delete__(this->inverse);
  }
  poVar13 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"solved with ",0xc);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->promotions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," promotions.",0xc);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  return;
LAB_0015b318:
  if (1 < (this->super_Solver).trace) {
    reportRegion(this,p);
  }
  to = (*(this->super_Solver)._vptr_Solver[4])(this,(ulong)i,(ulong)p);
  if (to == 0xffffffff) {
    setDominion(this,p);
    i = (int)((this->super_Solver).game)->n_vertices - 1;
    goto joined_r0x0015b282;
  }
  if (to == 0xfffffffe) goto LAB_0015b37e;
  promote(this,p,to);
  i = this->inverse[(int)to];
  p = to;
  goto LAB_0015b318;
LAB_0015b37e:
  if ((int)i < 0) goto LAB_0015b3be;
  while (((this->super_Solver).game)->_priority[i] == p) {
    bVar8 = (int)i < 1;
    i = i - 1;
    if (bVar8) goto LAB_0015b3be;
  }
  goto joined_r0x0015b282;
LAB_0015b368:
  if (((this->super_Solver).game)->_priority[i] != p) goto joined_r0x0015b282;
  bVar8 = (int)i < 1;
  i = i - 1;
  if (bVar8) goto LAB_0015b3be;
  goto LAB_0015b368;
}

Assistant:

void
PPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) resetRegion(p);
            continue;
        }

        inverse[p] = i;

        // PP: always reset region
        if (setupRegion(i, p, true)) {
            // region not empty, maybe promote
            while (true) {
#ifndef NDEBUG
                if (trace >= 2) reportRegion(p);
#endif
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) == p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    break;
                } else {
                    // found promotion, promote
                    promote(p, res);
                    // continue inner loop with the higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}